

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O3

string * __thiscall
str::concat<char_const(&)[1],std::__cxx11::string_const&>
          (string *__return_storage_ptr__,str *this,string_view delimiter,char (*arg) [1],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  size_t sVar1;
  ostream *poVar2;
  ostringstream stream;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  sVar1 = strlen(delimiter._M_str);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a8,delimiter._M_str,sVar1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)aoStack_1a8,(char *)delimiter._M_len,(long)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,*(char **)arg,*(long *)(arg + 8));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string concat(std::string_view delimiter, Arg&& arg, Args&&... args) {
        static_assert(sizeof...(Args) > 0, "This function needs at least 2 parameters");

        std::ostringstream stream;
        stream << arg;
        _concat(stream, delimiter, std::forward<Args>(args)...);
        return stream.str();
    }